

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::ArrayBuilder<kj::String>::removeLast(ArrayBuilder<kj::String> *this)

{
  RemoveConst<kj::String> *pRVar1;
  char *pcVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  
  pRVar1 = this->pos;
  this->pos = pRVar1 + -1;
  pcVar2 = pRVar1[-1].content.ptr;
  if (pcVar2 != (char *)0x0) {
    sVar3 = pRVar1[-1].content.size_;
    pRVar1[-1].content.ptr = (char *)0x0;
    pRVar1[-1].content.size_ = 0;
    pAVar4 = pRVar1[-1].content.disposer;
    (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pcVar2,1,sVar3,sVar3,0);
  }
  return;
}

Assistant:

void removeLast() {
    KJ_IREQUIRE(pos > ptr, "No elements present to remove.");
    kj::dtor(*--pos);
  }